

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O3

void GUIKeyCallback(HGUI handle,int key,int scancode,int action,int mods)

{
  GUI *gui;
  
  if (action == 0) {
    mu_input_keyup(*(mu_Context **)((long)handle + 0x10),
                   (int)*(char *)((long)handle + (long)key + 0x1a0880));
    return;
  }
  if (action == 1) {
    mu_input_keydown(*(mu_Context **)((long)handle + 0x10),
                     (int)*(char *)((long)handle + (long)key + 0x1a0880));
    return;
  }
  return;
}

Assistant:

void GUIKeyCallback(HGUI handle, int key, int scancode, int action, int mods) {
    GUI* gui = (GUI*)handle;
    GLFWwindow* window = gui->Window;
    if (action == GLFW_PRESS) {
        mu_input_keydown(gui->Ctx, gui->KeyMap[key]);
    }
    if (action == GLFW_RELEASE) {
        mu_input_keyup(gui->Ctx, gui->KeyMap[key]);
    }
}